

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamFormatParser_p.cpp
# Opt level: O3

void __thiscall BamTools::Internal::SamFormatParser::Parse(SamFormatParser *this,string *headerText)

{
  char cVar1;
  istream *piVar2;
  string headerLine;
  istringstream headerStream;
  string local_1c0;
  long local_1a0 [15];
  ios_base local_128 [264];
  
  SamHeader::Clear(this->m_header);
  if (headerText->_M_string_length != 0) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1a0,(string *)headerText,_S_in);
    local_1c0._M_string_length = 0;
    local_1c0.field_2._M_local_buf[0] = '\0';
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_1a0[0] + -0x18) +
                              (char)(istringstream *)local_1a0);
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1a0,(string *)&local_1c0,cVar1);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      ParseSamLine(this,&local_1c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1a0);
    std::ios_base::~ios_base(local_128);
  }
  return;
}

Assistant:

void SamFormatParser::Parse(const std::string& headerText)
{

    // clear header's prior contents
    m_header.Clear();

    // empty header is OK, but skip processing
    if (headerText.empty()) {
        return;
    }

    // other wise parse SAM lines
    std::istringstream headerStream(headerText);
    std::string headerLine;
    while (std::getline(headerStream, headerLine)) {
        ParseSamLine(headerLine);
    }
}